

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.cpp
# Opt level: O2

Proto * LoadFunction(LoadState *S,TString *p)

{
  StkId *ppTVar1;
  unsigned_short *puVar2;
  undefined2 uVar3;
  int iVar4;
  uint uVar5;
  undefined8 in_RAX;
  GCObject *pt;
  StkId pTVar6;
  TString *pTVar7;
  TValue *b;
  Table *pTVar8;
  Node *pNVar9;
  Proto *pPVar10;
  LocVar *pLVar11;
  TString **ppTVar12;
  ulong uVar13;
  lua_State *plVar14;
  size_t nsize;
  ulong uVar15;
  undefined8 local_38;
  
  plVar14 = S->L;
  uVar3 = plVar14->nCcalls;
  plVar14->nCcalls = uVar3 + 1;
  local_38 = in_RAX;
  if (200 < (ushort)(uVar3 + 1)) {
    error(S,"code too deep");
    plVar14 = S->L;
  }
  pt = (GCObject *)luaF_newproto(plVar14);
  pTVar6 = S->L->top;
  (pTVar6->value).gc = pt;
  pTVar6->tt = 9;
  plVar14 = S->L;
  pTVar6 = plVar14->top;
  if ((long)plVar14->stack_last - (long)pTVar6 < 0x11) {
    luaD_growstack(plVar14,1);
    plVar14 = S->L;
    pTVar6 = plVar14->top;
  }
  plVar14->top = pTVar6 + 1;
  pTVar7 = LoadString(S);
  if (pTVar7 != (TString *)0x0) {
    p = pTVar7;
  }
  (pt->p).source = p;
  iVar4 = LoadInt(S);
  (pt->p).linedefined = iVar4;
  iVar4 = LoadInt(S);
  (pt->p).lastlinedefined = iVar4;
  iVar4 = LoadChar(S);
  (pt->p).nups = (lu_byte)iVar4;
  iVar4 = LoadChar(S);
  (pt->p).numparams = (lu_byte)iVar4;
  iVar4 = LoadChar(S);
  (pt->p).is_vararg = (lu_byte)iVar4;
  iVar4 = LoadChar(S);
  (pt->p).maxstacksize = (lu_byte)iVar4;
  iVar4 = LoadInt(S);
  if (iVar4 < -1) {
    b = (TValue *)luaM_toobig(S->L);
  }
  else {
    b = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar4 << 2);
  }
  (pt->h).array = b;
  (pt->p).sizecode = iVar4;
  LoadBlock(S,b,(long)iVar4 << 2);
  uVar5 = LoadInt(S);
  if ((int)uVar5 < -1) {
    pTVar8 = (Table *)luaM_toobig(S->L);
  }
  else {
    pTVar8 = (Table *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 << 4);
  }
  (pt->h).metatable = pTVar8;
  (pt->p).sizek = uVar5;
  uVar13 = 0;
  uVar15 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar15 = uVar13;
  }
  for (; uVar15 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
    *(undefined4 *)((long)&pTVar8->tt + uVar13) = 0;
  }
  for (uVar13 = 0; uVar15 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
    pTVar8 = (pt->h).metatable;
    iVar4 = LoadChar(S);
    switch(iVar4) {
    case 0:
      *(undefined4 *)((long)&pTVar8->tt + uVar13) = 0;
      break;
    case 1:
      iVar4 = LoadChar(S);
      *(uint *)((long)&pTVar8->next + uVar13) = (uint)(iVar4 != 0);
      *(undefined4 *)((long)&pTVar8->tt + uVar13) = 1;
      break;
    default:
      error(S,"bad constant");
      break;
    case 3:
      LoadBlock(S,&local_38,8);
      *(undefined8 *)((long)&pTVar8->next + uVar13) = local_38;
      *(undefined4 *)((long)&pTVar8->tt + uVar13) = 3;
      break;
    case 4:
      pTVar7 = LoadString(S);
      *(TString **)((long)&pTVar8->next + uVar13) = pTVar7;
      *(undefined4 *)((long)&pTVar8->tt + uVar13) = 4;
    }
  }
  uVar5 = LoadInt(S);
  if ((int)uVar5 < -1) {
    pNVar9 = (Node *)luaM_toobig(S->L);
  }
  else {
    pNVar9 = (Node *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 << 3);
  }
  (pt->h).node = pNVar9;
  (pt->p).sizep = uVar5;
  uVar13 = 0;
  uVar15 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar15 = uVar13;
  }
  for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    (pt->p).p[uVar13] = (Proto *)0x0;
  }
  for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    pPVar10 = LoadFunction(S,(pt->p).source);
    (pt->p).p[uVar13] = pPVar10;
  }
  iVar4 = LoadInt(S);
  if (iVar4 < -1) {
    pNVar9 = (Node *)luaM_toobig(S->L);
    nsize = (long)iVar4 << 2;
  }
  else {
    nsize = (long)iVar4 << 2;
    pNVar9 = (Node *)luaM_realloc_(S->L,(void *)0x0,0,nsize);
  }
  (pt->h).lastfree = pNVar9;
  (pt->p).sizelineinfo = iVar4;
  LoadBlock(S,pNVar9,nsize);
  uVar5 = LoadInt(S);
  if ((int)uVar5 < -1) {
    pLVar11 = (LocVar *)luaM_toobig(S->L);
  }
  else {
    pLVar11 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 << 4);
  }
  (pt->p).locvars = pLVar11;
  (pt->p).sizelocvars = uVar5;
  uVar13 = 0;
  uVar15 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar15 = uVar13;
  }
  for (; uVar15 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
    *(undefined8 *)((long)&pLVar11->varname + uVar13) = 0;
  }
  for (uVar13 = 0; uVar15 * 0x10 != uVar13; uVar13 = uVar13 + 0x10) {
    pTVar7 = LoadString(S);
    *(TString **)((long)&((pt->p).locvars)->varname + uVar13) = pTVar7;
    iVar4 = LoadInt(S);
    *(int *)((long)&((pt->p).locvars)->startpc + uVar13) = iVar4;
    iVar4 = LoadInt(S);
    *(int *)((long)&((pt->p).locvars)->endpc + uVar13) = iVar4;
  }
  uVar5 = LoadInt(S);
  if ((int)uVar5 < -1) {
    ppTVar12 = (TString **)luaM_toobig(S->L);
  }
  else {
    ppTVar12 = (TString **)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar5 << 3);
  }
  (pt->p).upvalues = ppTVar12;
  (pt->p).sizeupvalues = uVar5;
  uVar13 = 0;
  uVar15 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar15 = uVar13;
  }
  for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    (pt->p).upvalues[uVar13] = (TString *)0x0;
  }
  for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    pTVar7 = LoadString(S);
    (pt->p).upvalues[uVar13] = pTVar7;
  }
  iVar4 = luaG_checkcode(&pt->p);
  if (iVar4 == 0) {
    error(S,"bad code");
  }
  plVar14 = S->L;
  ppTVar1 = &plVar14->top;
  *ppTVar1 = *ppTVar1 + -1;
  puVar2 = &plVar14->nCcalls;
  *puVar2 = *puVar2 - 1;
  return (Proto *)pt;
}

Assistant:

static Proto* LoadFunction(LoadState* S, TString* p)
{
 Proto* f;
 if (++S->L->nCcalls > LUAI_MAXCCALLS) error(S,"code too deep");
 f=luaF_newproto(S->L);
 setptvalue2s(S->L,S->L->top,f); incr_top(S->L);
 f->source=LoadString(S); if (f->source==NULL) f->source=p;
 f->linedefined=LoadInt(S);
 f->lastlinedefined=LoadInt(S);
 f->nups=LoadByte(S);
 f->numparams=LoadByte(S);
 f->is_vararg=LoadByte(S);
 f->maxstacksize=LoadByte(S);
 LoadCode(S,f);
 LoadConstants(S,f);
 LoadDebug(S,f);
 IF (!luaG_checkcode(f), "bad code");
 S->L->top--;
 S->L->nCcalls--;
 return f;
}